

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuImageCompare.cpp
# Opt level: O1

int tcu::measurePixelDiffAccuracy
              (TestLog *log,char *imageSetName,char *imageSetDesc,ConstPixelBufferAccess *reference,
              ConstPixelBufferAccess *result,int bestScoreDiff,int worstScoreDiff,
              CompareLogMode logMode)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  int iVar3;
  TestLog *this;
  int iVar4;
  int iVar5;
  int i;
  int iVar6;
  long lVar7;
  InternalError *this_00;
  uint uVar8;
  uint uVar9;
  ConstPixelBufferAccess *pCVar10;
  int iVar11;
  void *__buf;
  void *__buf_00;
  void *__buf_01;
  void *__buf_02;
  uint uVar12;
  long lVar13;
  undefined8 uVar14;
  _Alloc_hider _Var15;
  int iVar16;
  float fVar17;
  Vector<int,_4> res;
  IVec4 diff;
  Vec4 pixelScale;
  IVec4 a;
  IVec4 b;
  TextureLevel diffMask;
  int local_3d8;
  allocator<char> local_3ca;
  allocator<char> local_3c9;
  string local_3c8;
  undefined1 local_3a8 [40];
  TestLog *local_380;
  ConstPixelBufferAccess *local_378;
  int local_36c;
  string local_368;
  string local_348;
  LogImageSet local_328;
  Vec4 local_2e8;
  char *local_2d8;
  char *local_2d0;
  ConstPixelBufferAccess *local_2c8;
  undefined1 *local_2c0;
  undefined1 *puStack_2b8;
  string local_2b0;
  string local_290;
  long local_270;
  string local_268;
  string local_248;
  string local_228;
  undefined1 local_208 [96];
  qpKeyValueTag local_1a8;
  deInt64 local_1a0;
  undefined1 local_178 [96];
  qpKeyValueTag local_118;
  deInt64 local_110;
  LogImage local_e8;
  TextureLevel local_58;
  
  local_178._0_4_ = RGB;
  local_178._4_4_ = UNORM_INT8;
  local_36c = bestScoreDiff;
  TextureLevel::TextureLevel
            (&local_58,(TextureFormat *)local_178,(reference->m_size).m_data[0],
             (reference->m_size).m_data[1],1);
  TextureLevel::getAccess((PixelBufferAccess *)local_178,&local_58);
  if (((reference->m_format).type != UNORM_INT8) || ((result->m_format).type != UNORM_INT8)) {
    this_00 = (InternalError *)__cxa_allocate_exception(0x38);
    InternalError::InternalError
              (this_00,(char *)0x0,
               "ref.getFormat().type == TextureFormat::UNORM_INT8 && cmp.getFormat().type == TextureFormat::UNORM_INT8"
               ,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/framework/common/tcuImageCompare.cpp"
               ,0x125);
    __cxa_throw(this_00,&InternalError::typeinfo,Exception::~Exception);
  }
  local_380 = log;
  local_378 = reference;
  local_2d8 = imageSetDesc;
  local_2d0 = imageSetName;
  if ((result->m_size).m_data[1] < 1) {
    lVar13 = 0;
  }
  else {
    lVar13 = 0;
    local_3d8 = 0;
    local_2c8 = result;
    do {
      if (0 < (result->m_size).m_data[0]) {
        iVar16 = 0;
        do {
          ConstPixelBufferAccess::getPixelInt
                    ((ConstPixelBufferAccess *)local_208,(int)local_378,iVar16,local_3d8);
          ConstPixelBufferAccess::getPixelInt
                    ((ConstPixelBufferAccess *)&local_e8,(int)local_2c8,iVar16,local_3d8);
          local_3a8._0_4_ = R;
          local_3a8._4_4_ = SNORM_INT8;
          local_3a8._8_8_ = 0;
          lVar7 = 0;
          do {
            *(int *)(local_3a8 + lVar7 * 4) =
                 *(int *)(local_208 + lVar7 * 4) -
                 *(int *)((long)(&local_e8.m_access.m_size + -6) + lVar7 * 4);
            lVar7 = lVar7 + 1;
          } while (lVar7 != 4);
          local_328.m_name._M_dataplus._M_p = (pointer)0x0;
          local_328.m_name._M_string_length = 0;
          lVar7 = 0;
          do {
            iVar3 = *(int *)(local_3a8 + lVar7 * 4);
            iVar11 = -iVar3;
            if (0 < iVar3) {
              iVar11 = iVar3;
            }
            *(int *)((long)&local_328.m_name._M_dataplus._M_p + lVar7 * 4) = iVar11;
            lVar7 = lVar7 + 1;
          } while (lVar7 != 4);
          iVar3 = (int)local_328.m_name._M_dataplus._M_p;
          iVar11 = local_328.m_name._M_dataplus._M_p._4_4_;
          iVar4 = (int)local_328.m_name._M_string_length;
          iVar5 = local_328.m_name._M_string_length._4_4_;
          uVar8 = ((int)local_328.m_name._M_string_length + local_328.m_name._M_string_length._4_4_
                   + local_328.m_name._M_dataplus._M_p._4_4_ +
                  (int)local_328.m_name._M_dataplus._M_p) * 8;
          iVar6 = uVar8 - 0xff;
          if (0xfe < (int)uVar8) {
            uVar8 = 0xff;
          }
          iVar6 = -iVar6;
          if ((int)uVar8 < 1) {
            uVar8 = 0;
          }
          if (0xfe < iVar6) {
            iVar6 = 0xff;
          }
          if (iVar6 < 1) {
            iVar6 = 0;
          }
          local_3c8._M_dataplus._M_p =
               (pointer)(CONCAT44(local_3c8._M_dataplus._M_p._4_4_,iVar6 << 8 | uVar8) | 0xff000000)
          ;
          RGBA::toVec((RGBA *)local_3a8);
          PixelBufferAccess::setPixel
                    ((PixelBufferAccess *)local_178,(Vec4 *)local_3a8,iVar16,local_3d8,0);
          lVar13 = lVar13 + (iVar5 * iVar5 + iVar4 * iVar4 + iVar11 * iVar11 + iVar3 * iVar3);
          iVar16 = iVar16 + 1;
          result = local_2c8;
        } while (iVar16 < (local_2c8->m_size).m_data[0]);
      }
      local_3d8 = local_3d8 + 1;
    } while (local_3d8 < (result->m_size).m_data[1]);
  }
  fVar17 = (float)lVar13;
  local_270 = lVar13;
  if (fVar17 < 0.0) {
    fVar17 = sqrtf(fVar17);
  }
  else {
    fVar17 = SQRT(fVar17);
  }
  pCVar10 = local_378;
  this = local_380;
  fVar17 = floorf(100.0 - ((float)(-(uint)(0.0 <= fVar17 - (float)local_36c) &
                                  (uint)(fVar17 - (float)local_36c)) /
                          (float)(worstScoreDiff - local_36c)) * 100.0);
  uVar12 = (uint)fVar17;
  uVar8 = 100;
  if ((int)uVar12 < 100) {
    uVar8 = uVar12;
  }
  uVar9 = 0;
  if (0 < (int)uVar8) {
    uVar9 = uVar8;
  }
  local_2e8.m_data[0] = 0.0;
  local_2e8.m_data[1] = 0.0;
  local_2e8.m_data[2] = 0.0;
  local_2e8.m_data[3] = 0.0;
  local_2c0 = &DAT_3f8000003f800000;
  puStack_2b8 = &DAT_3f8000003f800000;
  iVar16 = (int)this;
  if ((logMode == COMPARE_LOG_EVERYTHING) || ((int)uVar12 < 0xb)) {
    if ((((result->m_format).order != RGBA) || ((result->m_format).type != UNORM_INT8)) &&
       (((pCVar10->m_format).order != RGBA || ((pCVar10->m_format).type != UNORM_INT8)))) {
      anon_unknown_50::computeScaleAndBias(pCVar10,result,(Vec4 *)&local_2c0,&local_2e8);
    }
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_3c8,local_2d0,&local_3c9);
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_348,local_2d8,&local_3ca);
    LogImageSet::LogImageSet(&local_328,&local_3c8,&local_348);
    TestLog::startImageSet
              (this,local_328.m_name._M_dataplus._M_p,local_328.m_description._M_dataplus._M_p);
    local_368._M_dataplus._M_p = (pointer)&local_368.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_368,"Result","");
    local_290._M_dataplus._M_p = (pointer)&local_290.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_290,"Result","");
    LogImage::LogImage((LogImage *)local_178,&local_368,&local_290,result,(Vec4 *)&local_2c0,
                       &local_2e8,QP_IMAGE_COMPRESSION_MODE_BEST);
    LogImage::write((LogImage *)local_178,iVar16,__buf_00,(size_t)result);
    local_228._M_dataplus._M_p = (pointer)&local_228.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_228,"Reference","");
    local_2b0._M_dataplus._M_p = (pointer)&local_2b0.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_2b0,"Reference","");
    LogImage::LogImage((LogImage *)local_208,&local_228,&local_2b0,pCVar10,(Vec4 *)&local_2c0,
                       &local_2e8,QP_IMAGE_COMPRESSION_MODE_BEST);
    LogImage::write((LogImage *)local_208,iVar16,__buf_01,(size_t)pCVar10);
    local_248._M_dataplus._M_p = (pointer)&local_248.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_248,"DiffMask","");
    local_268._M_dataplus._M_p = (pointer)&local_268.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_268,"Difference","");
    ConstPixelBufferAccess::ConstPixelBufferAccess((ConstPixelBufferAccess *)local_3a8,&local_58);
    pCVar10 = (ConstPixelBufferAccess *)local_3a8;
    LogImage::LogImage(&local_e8,&local_248,&local_268,pCVar10,QP_IMAGE_COMPRESSION_MODE_BEST);
    LogImage::write(&local_e8,iVar16,__buf_02,(size_t)pCVar10);
    TestLog::endImageSet(this);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_e8.m_description._M_dataplus._M_p != &local_e8.m_description.field_2) {
      operator_delete(local_e8.m_description._M_dataplus._M_p,
                      local_e8.m_description.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_e8.m_name._M_dataplus._M_p != &local_e8.m_name.field_2) {
      operator_delete(local_e8.m_name._M_dataplus._M_p,
                      local_e8.m_name.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_268._M_dataplus._M_p != &local_268.field_2) {
      operator_delete(local_268._M_dataplus._M_p,local_268.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_248._M_dataplus._M_p != &local_248.field_2) {
      operator_delete(local_248._M_dataplus._M_p,local_248.field_2._M_allocated_capacity + 1);
    }
    if ((undefined1 *)local_208._32_8_ != local_208 + 0x30) {
      operator_delete((void *)local_208._32_8_,local_208._48_8_ + 1);
    }
    if (local_208._0_8_ != (long)local_208 + 0x10) {
      operator_delete((void *)local_208._0_8_,local_208._16_8_ + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2b0._M_dataplus._M_p != &local_2b0.field_2) {
      operator_delete(local_2b0._M_dataplus._M_p,local_2b0.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_228._M_dataplus._M_p != &local_228.field_2) {
      operator_delete(local_228._M_dataplus._M_p,local_228.field_2._M_allocated_capacity + 1);
    }
    if ((undefined1 *)local_178._32_8_ != local_178 + 0x30) {
      operator_delete((void *)local_178._32_8_,local_178._48_8_ + 1);
    }
    if (local_178._0_8_ != (long)local_178 + 0x10) {
      operator_delete((void *)local_178._0_8_,local_178._16_8_ + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_290._M_dataplus._M_p != &local_290.field_2) {
      operator_delete(local_290._M_dataplus._M_p,local_290.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_368._M_dataplus._M_p != &local_368.field_2) {
      operator_delete(local_368._M_dataplus._M_p,local_368.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_328.m_description._M_dataplus._M_p != &local_328.m_description.field_2) {
      operator_delete(local_328.m_description._M_dataplus._M_p,
                      local_328.m_description.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_328.m_name._M_dataplus._M_p != &local_328.m_name.field_2) {
      operator_delete(local_328.m_name._M_dataplus._M_p,
                      local_328.m_name.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_348._M_dataplus._M_p != &local_348.field_2) {
      operator_delete(local_348._M_dataplus._M_p,local_348.field_2._M_allocated_capacity + 1);
    }
    uVar14 = local_3c8.field_2._M_allocated_capacity;
    _Var15._M_p = local_3c8._M_dataplus._M_p;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_3c8._M_dataplus._M_p == &local_3c8.field_2) goto LAB_00a9f91e;
  }
  else {
    if (logMode != COMPARE_LOG_RESULT) goto LAB_00a9f91e;
    if (((result->m_format).order != RGBA) || ((result->m_format).type != UNORM_INT8)) {
      computePixelScaleBias(result,(Vec4 *)&local_2c0,&local_2e8);
    }
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_e8,local_2d0,(allocator<char> *)&local_348);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_328,local_2d8,(allocator<char> *)&local_368);
    LogImageSet::LogImageSet((LogImageSet *)local_208,&local_e8.m_name,&local_328.m_name);
    TestLog::startImageSet(this,(char *)local_208._0_8_,(char *)local_208._32_8_);
    local_3a8._0_8_ = (long)local_3a8 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_3a8,"Result","");
    local_3c8._M_dataplus._M_p = (pointer)&local_3c8.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_3c8,"Result","");
    LogImage::LogImage((LogImage *)local_178,(string *)local_3a8,&local_3c8,result,
                       (Vec4 *)&local_2c0,&local_2e8,QP_IMAGE_COMPRESSION_MODE_BEST);
    LogImage::write((LogImage *)local_178,iVar16,__buf,(size_t)result);
    TestLog::endImageSet(this);
    if ((undefined1 *)local_178._32_8_ != local_178 + 0x30) {
      operator_delete((void *)local_178._32_8_,local_178._48_8_ + 1);
    }
    if (local_178._0_8_ != (long)local_178 + 0x10) {
      operator_delete((void *)local_178._0_8_,local_178._16_8_ + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_3c8._M_dataplus._M_p != &local_3c8.field_2) {
      operator_delete(local_3c8._M_dataplus._M_p,local_3c8.field_2._M_allocated_capacity + 1);
    }
    if (local_3a8._0_8_ != (long)local_3a8 + 0x10) {
      operator_delete((void *)local_3a8._0_8_,local_3a8._16_8_ + 1);
    }
    if ((undefined1 *)local_208._32_8_ != local_208 + 0x30) {
      operator_delete((void *)local_208._32_8_,local_208._48_8_ + 1);
    }
    if (local_208._0_8_ != (long)local_208 + 0x10) {
      operator_delete((void *)local_208._0_8_,local_208._16_8_ + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_328.m_name._M_dataplus._M_p != &local_328.m_name.field_2) {
      operator_delete(local_328.m_name._M_dataplus._M_p,
                      local_328.m_name.field_2._M_allocated_capacity + 1);
    }
    uVar14 = local_e8.m_name.field_2._M_allocated_capacity;
    _Var15._M_p = local_e8.m_name._M_dataplus._M_p;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_e8.m_name._M_dataplus._M_p == &local_e8.m_name.field_2) goto LAB_00a9f91e;
  }
  operator_delete(_Var15._M_p,uVar14 + 1);
LAB_00a9f91e:
  if ((logMode != COMPARE_LOG_ON_ERROR) || ((int)uVar12 < 0xb)) {
    paVar1 = &local_e8.m_name.field_2;
    local_e8.m_name._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_e8,"DiffSum","");
    paVar2 = &local_328.m_name.field_2;
    local_328.m_name._M_dataplus._M_p = (pointer)paVar2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_328,"Squared difference sum","");
    local_3a8._0_8_ = (long)local_3a8 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_3a8,"");
    LogNumber<long>::LogNumber
              ((LogNumber<long> *)local_178,&local_e8.m_name,&local_328.m_name,(string *)local_3a8,
               QP_KEY_TAG_NONE,local_270);
    TestLog::writeInteger
              (this,(char *)local_178._0_8_,(char *)local_178._32_8_,(char *)local_178._64_8_,
               local_118,local_110);
    local_3c8._M_dataplus._M_p = (pointer)&local_3c8.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_3c8,"Score","");
    local_348._M_dataplus._M_p = (pointer)&local_348.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_348,"Score","");
    local_368._M_dataplus._M_p = (pointer)&local_368.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_368,"");
    LogNumber<long>::LogNumber
              ((LogNumber<long> *)local_208,&local_3c8,&local_348,&local_368,QP_KEY_TAG_QUALITY,
               (ulong)uVar9);
    TestLog::writeInteger
              (local_380,(char *)local_208._0_8_,(char *)local_208._32_8_,(char *)local_208._64_8_,
               local_1a8,local_1a0);
    if (local_208._64_8_ != (long)local_208 + 0x50) {
      operator_delete((void *)local_208._64_8_,local_208._80_8_ + 1);
    }
    if ((undefined1 *)local_208._32_8_ != local_208 + 0x30) {
      operator_delete((void *)local_208._32_8_,local_208._48_8_ + 1);
    }
    if (local_208._0_8_ != (long)local_208 + 0x10) {
      operator_delete((void *)local_208._0_8_,local_208._16_8_ + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_368._M_dataplus._M_p != &local_368.field_2) {
      operator_delete(local_368._M_dataplus._M_p,local_368.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_348._M_dataplus._M_p != &local_348.field_2) {
      operator_delete(local_348._M_dataplus._M_p,local_348.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_3c8._M_dataplus._M_p != &local_3c8.field_2) {
      operator_delete(local_3c8._M_dataplus._M_p,local_3c8.field_2._M_allocated_capacity + 1);
    }
    if (local_178._64_8_ != (long)local_178 + 0x50) {
      operator_delete((void *)local_178._64_8_,local_178._80_8_ + 1);
    }
    if ((undefined1 *)local_178._32_8_ != local_178 + 0x30) {
      operator_delete((void *)local_178._32_8_,local_178._48_8_ + 1);
    }
    if (local_178._0_8_ != (long)local_178 + 0x10) {
      operator_delete((void *)local_178._0_8_,local_178._16_8_ + 1);
    }
    if (local_3a8._0_8_ != (long)local_3a8 + 0x10) {
      operator_delete((void *)local_3a8._0_8_,local_3a8._16_8_ + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_328.m_name._M_dataplus._M_p != paVar2) {
      operator_delete(local_328.m_name._M_dataplus._M_p,
                      local_328.m_name.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_e8.m_name._M_dataplus._M_p != paVar1) {
      operator_delete(local_e8.m_name._M_dataplus._M_p,
                      local_e8.m_name.field_2._M_allocated_capacity + 1);
    }
  }
  TextureLevel::~TextureLevel(&local_58);
  return uVar9;
}

Assistant:

int measurePixelDiffAccuracy (TestLog& log, const char* imageSetName, const char* imageSetDesc, const ConstPixelBufferAccess& reference, const ConstPixelBufferAccess& result, int bestScoreDiff, int worstScoreDiff, CompareLogMode logMode)
{
	TextureLevel	diffMask		(TextureFormat(TextureFormat::RGB, TextureFormat::UNORM_INT8), reference.getWidth(), reference.getHeight());
	int				diffFactor		= 8;
	deInt64			squaredSum		= computeSquaredDiffSum(reference, result, diffMask.getAccess(), diffFactor);
	float			sum				= deFloatSqrt((float)squaredSum);
	int				score			= deClamp32(deFloorFloatToInt32(100.0f - (de::max(sum-(float)bestScoreDiff, 0.0f) / (float)(worstScoreDiff-bestScoreDiff))*100.0f), 0, 100);
	const int		failThreshold	= 10;
	Vec4			pixelBias		(0.0f, 0.0f, 0.0f, 0.0f);
	Vec4			pixelScale		(1.0f, 1.0f, 1.0f, 1.0f);

	if (logMode == COMPARE_LOG_EVERYTHING || score <= failThreshold)
	{
		if (result.getFormat() != TextureFormat(TextureFormat::RGBA, TextureFormat::UNORM_INT8) && reference.getFormat() != TextureFormat(TextureFormat::RGBA, TextureFormat::UNORM_INT8))
			computeScaleAndBias(reference, result, pixelScale, pixelBias);

		log << TestLog::ImageSet(imageSetName, imageSetDesc)
			<< TestLog::Image("Result",		"Result",			result,		pixelScale, pixelBias)
			<< TestLog::Image("Reference",	"Reference",		reference,	pixelScale, pixelBias)
			<< TestLog::Image("DiffMask",	"Difference",		diffMask)
			<< TestLog::EndImageSet;
	}
	else if (logMode == COMPARE_LOG_RESULT)
	{
		if (result.getFormat() != TextureFormat(TextureFormat::RGBA, TextureFormat::UNORM_INT8))
			computePixelScaleBias(result, pixelScale, pixelBias);

		log << TestLog::ImageSet(imageSetName, imageSetDesc)
			<< TestLog::Image("Result",		"Result",			result,		pixelScale, pixelBias)
			<< TestLog::EndImageSet;
	}

	if (logMode != COMPARE_LOG_ON_ERROR || score <= failThreshold)
		log << TestLog::Integer("DiffSum", "Squared difference sum", "", QP_KEY_TAG_NONE, squaredSum)
			<< TestLog::Integer("Score", "Score", "", QP_KEY_TAG_QUALITY, score);

	return score;
}